

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.c
# Opt level: O3

void job_ini(job_t *job)

{
  memset(job,0,0x198);
  (job->cmdv).icd.sz = 8;
  (job->cmdv).icd.init = (undefined1 *)0x0;
  (job->cmdv).icd.copy = utarray_str_cpy;
  (job->cmdv).icd.dtor = utarray_str_dtor;
  (job->envv).icd.dtor = (undefined1 *)0x0;
  (job->envv).d = (char *)0x0;
  (job->envv).icd.init = (undefined1 *)0x0;
  (job->envv).icd.copy = (ctor_f *)0x0;
  (job->envv).i = 0;
  (job->envv).n = 0;
  (job->envv).icd.sz = 0;
  (job->envv).icd.copy = utarray_str_cpy;
  (job->envv).icd.dtor = utarray_str_dtor;
  (job->envv).icd.sz = 8;
  (job->envv).icd.init = (undefined1 *)0x0;
  (job->depv).icd.dtor = (undefined1 *)0x0;
  (job->depv).d = (char *)0x0;
  (job->depv).icd.init = (undefined1 *)0x0;
  (job->depv).icd.copy = (ctor_f *)0x0;
  (job->depv).i = 0;
  (job->depv).n = 0;
  (job->depv).icd.sz = 0;
  (job->depv).icd.copy = utarray_str_cpy;
  (job->depv).icd.dtor = utarray_str_dtor;
  (job->depv).icd.sz = 8;
  (job->depv).icd.init = (undefined1 *)0x0;
  (job->rlim).icd.dtor = (undefined1 *)0x0;
  (job->rlim).d = (char *)0x0;
  (job->rlim).icd.init = (undefined1 *)0x0;
  (job->rlim).icd.copy = (ctor_f *)0x0;
  (job->rlim).i = 0;
  (job->rlim).n = 0;
  (job->rlim).icd.sz = 0;
  (job->rlim).icd.copy = (ctor_f *)0x0;
  (job->rlim).icd.dtor = (undefined1 *)0x0;
  (job->rlim).icd.sz = 0x18;
  (job->rlim).icd.init = (undefined1 *)0x0;
  (job->cpuset).__bits[0xe] = 0;
  (job->cpuset).__bits[0xf] = 0;
  (job->cpuset).__bits[0xc] = 0;
  (job->cpuset).__bits[0xd] = 0;
  (job->cpuset).__bits[10] = 0;
  (job->cpuset).__bits[0xb] = 0;
  (job->cpuset).__bits[8] = 0;
  (job->cpuset).__bits[9] = 0;
  (job->cpuset).__bits[6] = 0;
  (job->cpuset).__bits[7] = 0;
  (job->cpuset).__bits[4] = 0;
  (job->cpuset).__bits[5] = 0;
  (job->cpuset).__bits[2] = 0;
  (job->cpuset).__bits[3] = 0;
  (job->cpuset).__bits[0] = 0;
  (job->cpuset).__bits[1] = 0;
  job->respawn = 1;
  return;
}

Assistant:

void job_ini(job_t *job) { 
  memset(job,0,sizeof(*job));
  utarray_init(&job->cmdv, &ut_str_icd); 
  utarray_init(&job->envv, &ut_str_icd); 
  utarray_init(&job->depv, &ut_str_icd); 
  utarray_init(&job->rlim, &rlimit_icd); 
  CPU_ZERO(&job->cpuset);
  job->respawn=1;
}